

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Dam_ManCreatePairs(Dam_Man_t *p,int fVerbose)

{
  long lVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  size_t __size;
  uint uVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int v;
  int iVar13;
  int iVar14;
  Vec_Int_t *p_00;
  int *piVar15;
  Hash_IntMan_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar16;
  Hash_IntMan_t *pHVar17;
  Vec_Flt_t *pVVar18;
  float *pfVar19;
  Vec_Que_t *pVVar20;
  Vec_Int_t *pVVar21;
  void *__s;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  double dVar34;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  int local_c0;
  int local_bc;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  ulong local_40;
  ulong local_38;
  
  Dam_ManCollectSets(p);
  pVVar21 = p->pGia->vSuper;
  iVar11 = p->pGia->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar22 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar22 = iVar11;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar22;
  iVar9 = 0;
  if (iVar22 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc((long)iVar22 << 2);
  }
  p_00->pArray = piVar15;
  p_01 = Hash_IntManStart(iVar11 / 2);
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 1000;
  p_02->nSize = 0;
  piVar15 = (int *)malloc(4000);
  p_02->pArray = piVar15;
  p_02->nSize = 1000;
  memset(piVar15,0,4000);
  Dam_ManCreateMultiRefs(p,&local_48,&local_50);
  pVVar8 = local_48;
  pVVar7 = local_50;
  pGVar16 = p->pGia;
  uVar24 = (ulong)(uint)pGVar16->nObjs;
  local_c0 = 0;
  iVar11 = 0;
  local_bc = 0;
  if (0 < pGVar16->nObjs) {
    lVar33 = 0;
    local_bc = 0;
    iVar11 = 0;
    local_c0 = 0;
    iVar9 = 0;
    do {
      if (pGVar16->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar16->pObjs + lVar33;
      if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
        pVVar5 = p->vNod2Set;
        if ((lVar33 < pVVar5->nSize) && (pVVar5->pArray[lVar33] != 0)) {
          uVar10 = 0;
          if (lVar33 < pVVar5->nSize) {
            uVar10 = pVVar5->pArray[lVar33];
          }
          if (uVar10 == 0) {
            piVar15 = (int *)0x0;
          }
          else {
            if (((int)uVar10 < 0) || (p->vSetStore->nSize <= (int)uVar10)) goto LAB_0067e5be;
            piVar15 = p->vSetStore->pArray + uVar10;
          }
          iVar22 = *piVar15;
          pVVar21->nSize = 0;
          uVar10 = (uint)*(undefined8 *)pGVar2;
          bVar6 = (~uVar10 & 0x1fffffff) == 0 || (int)uVar10 < 0;
          if (bVar6) goto LAB_0067e678;
          uVar12 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
          if ((uVar10 & 0x1fffffff) < (uVar12 & 0x1fffffff)) {
            if (0 < *piVar15) {
              lVar27 = 0;
              do {
                uVar10 = piVar15[lVar27 + 1];
                if ((int)uVar10 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                if (pVVar7->nSize <= (int)(uVar10 >> 1)) goto LAB_0067e59f;
                if (1 < pVVar7->pArray[uVar10 >> 1]) {
                  Vec_IntPush(pVVar21,uVar10);
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 < *piVar15);
            }
          }
          else {
            if ((bVar6) || ((uVar10 & 0x1fffffff) <= (uVar12 & 0x1fffffff))) {
LAB_0067e678:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                            ,0x270,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
            }
            if ((int)uVar24 <= lVar33) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if ((pGVar16->pMuxes != (uint *)0x0) && (pGVar16->pMuxes[lVar33] != 0))
            goto LAB_0067e678;
            if (0 < *piVar15) {
              lVar27 = 0;
              do {
                iVar29 = piVar15[lVar27 + 1];
                if (((long)iVar29 < 0) || (pVVar8->nSize <= iVar29)) goto LAB_0067e59f;
                if (1 < pVVar8->pArray[iVar29]) {
                  Vec_IntPush(pVVar21,iVar29);
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 < *piVar15);
            }
          }
          iVar9 = iVar9 + ((iVar22 + -1) * iVar22) / 2;
          iVar22 = pVVar21->nSize;
          if (1 < iVar22) {
            local_c0 = local_c0 + ((iVar22 + -1) * iVar22) / 2;
            Vec_IntPush(p_00,-(int)lVar33);
            if (0 < pVVar21->nSize) {
              lVar28 = 1;
              lVar27 = 0;
              do {
                lVar1 = lVar27 + 1;
                if (lVar1 < pVVar21->nSize) {
                  piVar15 = pVVar21->pArray;
                  iVar22 = piVar15[lVar27];
                  lVar27 = lVar28;
                  do {
                    iVar29 = pVVar21->pArray[lVar27];
                    bVar6 = iVar29 < iVar22;
                    uVar10 = (uint)*(undefined8 *)pGVar2;
                    iVar25 = iVar22;
                    if ((((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) &&
                        (uVar10 & 0x1fffffff) <
                        ((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) & 0x1fffffff)) == bVar6) {
                      iVar25 = iVar29;
                      iVar29 = iVar22;
                    }
                    uVar10 = Hash_Int2ManInsert(p_01,iVar29,iVar25,
                                                (int)CONCAT71((int7)((ulong)piVar15 >> 8),bVar6));
                    if ((int)uVar10 < 0) goto LAB_0067e5be;
                    uVar12 = uVar10 * 4;
                    uVar23 = p_01->vObjs->nSize;
                    if (uVar23 == uVar12 ||
                        SBORROW4(uVar23,uVar12) != (int)(uVar23 + uVar10 * -4) < 0)
                    goto LAB_0067e5be;
                    piVar15 = p_01->vObjs->pArray;
                    iVar29 = piVar15[(ulong)uVar12 + 2];
                    piVar15[(ulong)uVar12 + 2] = iVar29 + 1;
                    if (iVar29 == 1) {
                      uVar12 = (uint)*(undefined8 *)pGVar2;
                      uVar23 = 0;
                      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
                        uVar23 = (uint)((uVar12 & 0x1fffffff) <
                                       ((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) & 0x1fffffff));
                      }
                      iVar11 = iVar11 + 1;
                      local_bc = local_bc + uVar23;
                    }
                    Vec_IntPush(p_00,uVar10);
                    if (p_02->nSize <= (int)uVar10) {
                      Vec_IntFillExtra(p_02,(p_02->nSize * 3) / 2,0);
                    }
                    if ((p->vNodLevR->nSize <= lVar33) || (p_02->nSize <= (int)uVar10))
                    goto LAB_0067e59f;
                    iVar29 = p->vNodLevR->pArray[lVar33];
                    piVar15 = p_02->pArray;
                    if (piVar15[uVar10] < iVar29) {
                      piVar15[uVar10] = iVar29;
                    }
                    lVar27 = lVar27 + 1;
                  } while ((int)lVar27 < pVVar21->nSize);
                }
                lVar28 = lVar28 + 1;
                lVar27 = lVar1;
              } while (lVar1 < pVVar21->nSize);
            }
          }
        }
      }
      lVar33 = lVar33 + 1;
      pGVar16 = p->pGia;
      uVar24 = (ulong)pGVar16->nObjs;
    } while (lVar33 < (long)uVar24);
  }
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
    local_48->pArray = (int *)0x0;
  }
  if (local_48 != (Vec_Int_t *)0x0) {
    free(local_48);
  }
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
    local_50->pArray = (int *)0x0;
  }
  if (local_50 != (Vec_Int_t *)0x0) {
    free(local_50);
  }
  pHVar17 = Hash_IntManStart((iVar11 * 3) / 2);
  p->vHash = pHVar17;
  iVar22 = iVar11 * 2;
  pVVar18 = (Vec_Flt_t *)malloc(0x10);
  iVar29 = 0x10;
  if (0xe < iVar11 * 2 - 1U) {
    iVar29 = iVar22;
  }
  pVVar18->nSize = 0;
  pVVar18->nCap = iVar29;
  lVar33 = (long)iVar29;
  if (iVar29 == 0) {
    pfVar19 = (float *)0x0;
  }
  else {
    pfVar19 = (float *)malloc(lVar33 * 4);
  }
  pVVar18->pArray = pfVar19;
  p->vCounts = pVVar18;
  if (iVar29 == 0) {
    if (pfVar19 == (float *)0x0) {
      pfVar19 = (float *)malloc(0x40);
    }
    else {
      pfVar19 = (float *)realloc(pfVar19,0x40);
    }
    pVVar18->pArray = pfVar19;
    pVVar18->nCap = 0x10;
  }
  pVVar18->nSize = 1;
  *pVVar18->pArray = 1e+09;
  uVar10 = pVVar18->nCap;
  pVVar20 = (Vec_Que_t *)calloc(1,0x20);
  uVar24 = 0x10;
  if (0x10 < (int)uVar10) {
    uVar24 = (ulong)uVar10;
  }
  pVVar20->nSize = 1;
  pVVar20->nCap = (int)uVar24 + 1;
  __size = uVar24 * 4 + 4;
  piVar15 = (int *)malloc(__size);
  memset(piVar15,0xff,__size);
  pVVar20->pHeap = piVar15;
  piVar15 = (int *)malloc(__size);
  memset(piVar15,0xff,__size);
  pVVar20->pOrder = piVar15;
  p->vQue = pVVar20;
  if (pVVar20->pCostsFlt != (float **)0x0) {
    __assert_fail("p->pCostsFlt == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
  }
  pVVar20->pCostsFlt = &pVVar18->pArray;
  pVVar21 = (Vec_Int_t *)malloc(0x10);
  pVVar21->nSize = 0;
  pVVar21->nCap = iVar29;
  if (iVar29 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar33 * 4);
  }
  pVVar21->pArray = piVar15;
  p->vDiv2Nod = pVVar21;
  Vec_IntPush(pVVar21,1000000000);
  uVar10 = p->pGia->nObjs;
  pVVar21 = (Vec_Int_t *)malloc(0x10);
  if (uVar10 - 1 < 0xf) {
    uVar10 = 0x10;
  }
  pVVar21->nSize = 0;
  pVVar21->nCap = uVar10;
  if (uVar10 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc((long)(int)uVar10 << 2);
  }
  pVVar21->pArray = piVar15;
  p->vNodStore = pVVar21;
  Vec_IntPush(pVVar21,-1);
  pVVar21 = p_01->vObjs;
  iVar25 = pVVar21->nSize;
  iVar14 = iVar25 + 3;
  if (-1 < iVar25) {
    iVar14 = iVar25;
  }
  uVar23 = iVar14 >> 2;
  uVar12 = uVar23 - 1;
  uVar10 = 0x10;
  if (0xe < uVar12) {
    uVar10 = uVar23;
  }
  iVar14 = 0;
  if (uVar10 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar10 << 2);
  }
  memset(__s,0xff,(long)(int)uVar23 << 2);
  uVar10 = 0;
  if (7 < iVar25) {
    uVar24 = 2;
    if (2 < (int)uVar23) {
      uVar24 = (ulong)uVar23;
    }
    uVar10 = 0;
    uVar32 = 1;
    iVar14 = 0;
    local_40 = uVar24;
    local_38 = (ulong)uVar23;
    do {
      if ((long)pVVar21->nSize <= (long)(uVar32 * 4)) goto LAB_0067e5be;
      piVar15 = pVVar21->pArray;
      iVar25 = piVar15[uVar32 * 4 + 2];
      if (1 < iVar25) {
        iVar30 = 0;
        if (piVar15[uVar32 * 4 + 1] < piVar15[uVar32 * 4]) {
          iVar30 = iVar25;
        }
        v = Hash_Int2ManInsert(p->vHash,piVar15[uVar32 * 4],piVar15[uVar32 * 4 + 1],(int)uVar24);
        iVar13 = p->vHash->vObjs->nSize;
        iVar26 = iVar13 + 3;
        if (-1 < iVar13) {
          iVar26 = iVar13;
        }
        if (v != (iVar26 >> 2) + -1) {
          __assert_fail("Num == Hash_IntManEntryNum(p->vHash)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x29f,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        pVVar18 = p->vCounts;
        if (v != pVVar18->nSize) {
          __assert_fail("Num == Vec_FltSize(p->vCounts)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x2a0,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        if ((long)pVVar21->nSize <= (long)(uVar32 * 4)) goto LAB_0067e5be;
        if ((long)p_02->nSize <= (long)uVar32) goto LAB_0067e59f;
        iVar13 = Dam_ManDivSlack(p,pVVar21->pArray[uVar32 * 4],pVVar21->pArray[uVar32 * 4 + 1],
                                 p_02->pArray[uVar32]);
        uVar4 = pVVar18->nCap;
        if (pVVar18->nSize == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (pVVar18->pArray == (float *)0x0) {
              pfVar19 = (float *)malloc(0x40);
            }
            else {
              pfVar19 = (float *)realloc(pVVar18->pArray,0x40);
            }
            pVVar18->pArray = pfVar19;
            iVar26 = 0x10;
          }
          else {
            iVar26 = uVar4 * 2;
            if (iVar26 <= (int)uVar4) goto LAB_0067e15d;
            if (pVVar18->pArray == (float *)0x0) {
              pfVar19 = (float *)malloc((ulong)uVar4 << 3);
            }
            else {
              pfVar19 = (float *)realloc(pVVar18->pArray,(ulong)uVar4 << 3);
            }
            pVVar18->pArray = pfVar19;
          }
          pVVar18->nCap = iVar26;
        }
LAB_0067e15d:
        iVar26 = pVVar18->nSize;
        pVVar18->nSize = iVar26 + 1;
        pVVar18->pArray[iVar26] = (float)iVar13 * 0.005 + (float)iVar25;
        Vec_QuePush(p->vQue,v);
        if (v != p->vDiv2Nod->nSize) {
          __assert_fail("Num == Vec_IntSize(p->vDiv2Nod)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x2a4,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        Vec_IntPush(p->vDiv2Nod,p->vNodStore->nSize);
        Vec_IntPush(p->vNodStore,0);
        Vec_IntFillExtra(p->vNodStore,p->vNodStore->nSize + iVar25,-1);
        if (local_38 <= uVar32) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar14 = iVar14 + iVar25;
        uVar10 = uVar10 + iVar30;
        *(int *)((long)__s + uVar32 * 4) = v;
        uVar24 = local_40;
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 != uVar24);
  }
  iVar25 = p->vHash->vObjs->nSize;
  iVar30 = iVar25 + 3;
  if (-1 < iVar25) {
    iVar30 = iVar25;
  }
  if (p->vCounts->nSize != iVar30 >> 2) {
    __assert_fail("Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                  ,0x2ab,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (p->vDiv2Nod->nSize != iVar11 + 1) {
    __assert_fail("Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                  ,0x2ac,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (pVVar21->pArray != (int *)0x0) {
    free(pVVar21->pArray);
    pVVar21->pArray = (int *)0x0;
  }
  if (pVVar21 != (Vec_Int_t *)0x0) {
    free(pVVar21);
  }
  pVVar21 = p_01->vTable;
  if (pVVar21->pArray != (int *)0x0) {
    free(pVVar21->pArray);
    pVVar21->pArray = (int *)0x0;
  }
  if (pVVar21 != (Vec_Int_t *)0x0) {
    free(pVVar21);
  }
  free(p_01);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (int *)0x0;
  }
  free(p_02);
  iVar25 = p_00->nSize;
  if (0 < (long)iVar25) {
    piVar15 = p_00->pArray;
    iVar30 = -1;
    lVar27 = 0;
    do {
      iVar13 = piVar15[lVar27];
      if ((long)iVar13 < 0) {
        iVar30 = -iVar13;
      }
      else {
        if ((int)uVar23 <= iVar13) goto LAB_0067e59f;
        uVar4 = *(uint *)((long)__s + (long)iVar13 * 4);
        if ((ulong)uVar4 != 0xffffffff) {
          uVar31 = 0;
          if ((int)uVar4 < p->vDiv2Nod->nSize) {
            if ((int)uVar4 < 0) {
LAB_0067e59f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar31 = p->vDiv2Nod->pArray[uVar4];
          }
          if (((int)uVar31 < 0) || (p->vNodStore->nSize <= (int)uVar31)) {
LAB_0067e5be:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar3 = p->vNodStore->pArray + uVar31;
          iVar13 = *piVar3;
          *piVar3 = iVar13 + 1;
          piVar3[(long)iVar13 + 1] = iVar30;
        }
      }
      lVar27 = lVar27 + 1;
    } while (iVar25 != lVar27);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pVVar21 = (Vec_Int_t *)malloc(0x10);
  pVVar21->nSize = 0;
  pVVar21->nCap = iVar29;
  if (iVar29 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar33 << 2);
  }
  pVVar21->pArray = piVar15;
  pVVar21->nSize = iVar22;
  memset(piVar15,0,(long)iVar22 << 2);
  p->vDivLevR = pVVar21;
  if (fVerbose != 0) {
    printf("Pairs:");
    iVar22 = 1;
    if (1 < iVar9) {
      iVar22 = iVar9;
    }
    dVar34 = (double)iVar22;
    printf("  Total =%9d (%6.2f %%)",((double)iVar9 * 100.0) / dVar34);
    printf("  Tried =%9d (%6.2f %%)",((double)local_c0 * 100.0) / dVar34);
    printf("  Used =%9d (%6.2f %%)",((double)iVar14 * 100.0) / dVar34);
    printf("  Xor =%9d (%6.2f %%)",((double)(int)uVar10 * 100.0) / dVar34,(ulong)uVar10);
    putchar(10);
    printf("Div:  ");
    uVar10 = 1;
    if (1 < (int)uVar12) {
      uVar10 = uVar12;
    }
    dVar34 = (double)(int)uVar10;
    printf("  Total =%9d (%6.2f %%)",(ulong)uVar12);
    printf("  Tried =%9d (%6.2f %%)",((double)(int)uVar12 * 100.0) / dVar34,(ulong)uVar12);
    printf("  Used =%9d (%6.2f %%)",((double)iVar11 * 100.0) / dVar34);
    printf("  Xor =%9d (%6.2f %%)",((double)local_bc * 100.0) / dVar34);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Dam_ManCreatePairs( Dam_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Hash_IntMan_t * vHash;
    Vec_Int_t * vRefsAnd, * vRefsXor, * vSuper, * vDivs, * vRemap, * vLevRMax;
    int i, j, k, Num, FanK, FanJ, nRefs, iNode, iDiv, * pSet;
    int nPairsAll = 0, nPairsTried = 0, nPairsUsed = 0, nPairsXor = 0;
    int nDivsAll = 0, nDivsUsed = 0, nDivsXor = 0;
    Dam_ManCollectSets( p );
    vSuper = p->pGia->vSuper;
    vDivs  = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    vHash  = Hash_IntManStart( Gia_ManObjNum(p->pGia)/2 );
    vLevRMax = Vec_IntStart( 1000 );
    Dam_ManCreateMultiRefs( p, &vRefsAnd, &vRefsXor );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        nPairsAll += pSet[0] * (pSet[0] - 1) / 2;
        Vec_IntClear(vSuper);
        if ( Gia_ObjIsXor(pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsXor, Abc_Lit2Var(pSet[k])) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsAnd, pSet[k]) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else assert( 0 );
        if ( Vec_IntSize(vSuper) < 2 )
            continue;
        // enumerate pairs
        nPairsTried += Vec_IntSize(vSuper) * (Vec_IntSize(vSuper) - 1) / 2;
        Vec_IntPush( vDivs, -i ); // remember node
        Vec_IntForEachEntry( vSuper, FanK, k )
        Vec_IntForEachEntryStart( vSuper, FanJ, j, k+1 )
        {
            if ( (FanK > FanJ) ^ Gia_ObjIsXor(pObj) )
                Num = Hash_Int2ManInsert( vHash, FanJ, FanK, 0 );
            else
                Num = Hash_Int2ManInsert( vHash, FanK, FanJ, 0 );
            if ( Hash_Int2ObjInc( vHash, Num ) == 1 )
            {
                nDivsUsed++;
                nDivsXor += Gia_ObjIsXor(pObj);
            }
            Vec_IntPush( vDivs, Num ); // remember devisor
            // update reverse level
            if ( Num >= Vec_IntSize(vLevRMax) )
                Vec_IntFillExtra( vLevRMax, 3 * Vec_IntSize(vLevRMax) / 2, 0 );
            Vec_IntUpdateEntry( vLevRMax, Num, Vec_IntEntry(p->vNodLevR, i) );
        }
    }
    Vec_IntFree( vRefsAnd );
    Vec_IntFree( vRefsXor );
//    Hash_IntManProfile( vHash );
    // remove entries that appear only once
    p->vHash     = Hash_IntManStart( 3 * nDivsUsed /2 );
    p->vCounts   = Vec_FltAlloc( 2 * nDivsUsed );           Vec_FltPush( p->vCounts, ABC_INFINITY );
    p->vQue      = Vec_QueAlloc( Vec_FltCap(p->vCounts) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // mapping div to node
    p->vDiv2Nod  = Vec_IntAlloc( 2 * nDivsUsed );           Vec_IntPush( p->vDiv2Nod, ABC_INFINITY );
    p->vNodStore = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );  Vec_IntPush( p->vNodStore, -1 );
    nDivsAll     = Hash_IntManEntryNum(vHash);
    vRemap       = Vec_IntStartFull( nDivsAll+1 );
    for ( i = 1; i <= nDivsAll; i++ )
    {
        nRefs = Hash_IntObjData2(vHash, i);
        if ( nRefs < 2 )
            continue;
        nPairsUsed += nRefs;
        if ( Hash_IntObjData0(vHash, i) > Hash_IntObjData1(vHash, i) )
            nPairsXor += nRefs; 
        Num = Hash_Int2ManInsert( p->vHash, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), 0 );
        assert( Num == Hash_IntManEntryNum(p->vHash) );
        assert( Num == Vec_FltSize(p->vCounts) );
        Vec_FltPush( p->vCounts, nRefs + 0.005*Dam_ManDivSlack(p, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), Vec_IntEntry(vLevRMax, i)) );
        Vec_QuePush( p->vQue, Num );
        // remember divisors
        assert( Num == Vec_IntSize(p->vDiv2Nod) );
        Vec_IntPush( p->vDiv2Nod, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        // remember entry
        Vec_IntWriteEntry( vRemap, i, Num );
    }
    assert( Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1 );
    assert( Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1 );
    Hash_IntManStop( vHash );
    Vec_IntFree( vLevRMax );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDiv, i )
    {
        if ( iDiv < 0 )
        {
            iNode = -iDiv;
            continue;
        }
        Num = Vec_IntEntry( vRemap, iDiv );
        if ( Num == -1 )
            continue;
        pSet = Dam_DivSet( p, Num );
        pSet[++pSet[0]] = iNode;
    }
    Vec_IntFree( vRemap );
    Vec_IntFree( vDivs );
    // create storage for reverse level of divisor during update
    p->vDivLevR = Vec_IntStart( 2 * nDivsUsed );
    // make sure divisors are added correctly
//    for ( i = 1; i <= nDivsUsed; i++ )
//        assert( Dam_DivSet(p, i)[0] == Vec_FltEntry(p->vCounts, i)+1 );
    if ( !fVerbose )
        return;
    // print stats
    printf( "Pairs:" );
    printf( "  Total =%9d (%6.2f %%)", nPairsAll,   100.0 * nPairsAll   / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nPairsTried, 100.0 * nPairsTried / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nPairsUsed,  100.0 * nPairsUsed  / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nPairsXor,   100.0 * nPairsXor   / Abc_MaxInt(nPairsAll, 1) );
    printf( "\n" );
    printf( "Div:  " );
    printf( "  Total =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nDivsUsed,   100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nDivsXor,    100.0 * nDivsXor    / Abc_MaxInt(nDivsAll, 1) );
    printf( "\n" );
}